

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  reference ppLVar7;
  long *in_RSI;
  long in_RDI;
  int lr;
  int pdlr;
  char blob_name [256];
  Blob *blob_2;
  int j_1;
  Blob *blob;
  Blob *blob_1;
  int bottom_blob_index;
  char bottom_name [256];
  int j;
  Layer *layer;
  int top_count;
  int bottom_count;
  char layer_name [256];
  char layer_type [256];
  int i;
  int blob_index;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  Layer *in_stack_fffffffffffff158;
  undefined4 in_stack_fffffffffffff160;
  int in_stack_fffffffffffff164;
  int in_stack_fffffffffffff168;
  int in_stack_fffffffffffff16c;
  ParamDict *in_stack_fffffffffffff170;
  int in_stack_fffffffffffff178;
  int in_stack_fffffffffffff17c;
  Net *in_stack_fffffffffffff180;
  string *in_stack_fffffffffffff190;
  string *in_stack_fffffffffffff198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1a0;
  undefined1 local_e19 [33];
  undefined1 local_df8 [256];
  reference local_cf8;
  int local_cec;
  reference local_ce8;
  undefined1 local_cd9 [33];
  reference local_cb8;
  int local_cac;
  undefined1 local_ca8 [256];
  int local_ba8;
  undefined1 local_ba1 [40];
  allocator<char> local_b79;
  string local_b78 [32];
  Layer *local_b58;
  undefined4 local_b50;
  int local_b40;
  int local_b3c;
  undefined1 local_b38 [256];
  undefined1 local_a38 [264];
  int local_930;
  int local_92c;
  undefined1 local_928 [2308];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_1c);
  if (iVar1 == 1) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      local_24 = 0;
      iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_20);
      if (iVar1 == 1) {
        iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_24);
        if (iVar1 == 1) {
          if ((local_20 < 1) || (local_24 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count\n");
            local_4 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffff180,
                       CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffff180,
                       CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
            ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff1a0);
            local_92c = 0;
            for (local_930 = 0; local_930 < local_20; local_930 = local_930 + 1) {
              local_b3c = 0;
              local_b40 = 0;
              iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_a38);
              if (iVar1 != 1) {
                fprintf(_stderr,"parse layer_type failed\n");
                local_4 = -1;
                goto LAB_00116ba9;
              }
              iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_b38);
              if (iVar2 != 1) {
                fprintf(_stderr,"parse layer_name failed\n");
                local_4 = -1;
                goto LAB_00116ba9;
              }
              iVar3 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_b3c);
              if (iVar3 != 1) {
                fprintf(_stderr,"parse bottom_count failed\n");
                local_4 = -1;
                goto LAB_00116ba9;
              }
              iVar4 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_b40);
              if (iVar4 != 1) {
                fprintf(_stderr,"parse top_count failed\n");
                local_4 = -1;
                goto LAB_00116ba9;
              }
              local_b58 = create_layer((char *)in_stack_fffffffffffff158);
              if (local_b58 == (Layer *)0x0) {
                local_b58 = create_custom_layer((Net *)CONCAT44(in_stack_fffffffffffff16c,
                                                                in_stack_fffffffffffff168),
                                                (char *)CONCAT44(in_stack_fffffffffffff164,
                                                                 in_stack_fffffffffffff160));
              }
              if (local_b58 == (Layer *)0x0) {
                fprintf(_stderr,"layer %s not exists or registered\n",local_a38);
                clear(in_stack_fffffffffffff180);
                local_4 = -1;
                goto LAB_00116ba9;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff1a0,(char *)in_stack_fffffffffffff198,
                         (allocator<char> *)in_stack_fffffffffffff190);
              in_stack_fffffffffffff198 = local_b78;
              std::__cxx11::string::operator=((string *)&local_b58->type,in_stack_fffffffffffff198);
              std::__cxx11::string::~string(in_stack_fffffffffffff198);
              std::allocator<char>::~allocator(&local_b79);
              in_stack_fffffffffffff1a0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ba1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff1a0,(char *)in_stack_fffffffffffff198,
                         (allocator<char> *)in_stack_fffffffffffff190);
              in_stack_fffffffffffff190 = (string *)(local_ba1 + 1);
              std::__cxx11::string::operator=((string *)&local_b58->name,in_stack_fffffffffffff190);
              std::__cxx11::string::~string(in_stack_fffffffffffff190);
              std::allocator<char>::~allocator((allocator<char> *)local_ba1);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff180,
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
              for (local_ba8 = 0; local_ba8 < local_b3c; local_ba8 = local_ba8 + 1) {
                iVar5 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_ca8);
                if (iVar5 != 1) {
                  fprintf(_stderr,"parse bottom_name failed\n");
                  local_4 = -1;
                  goto LAB_00116ba9;
                }
                local_cac = find_blob_index_by_name
                                      ((Net *)CONCAT44(in_stack_fffffffffffff17c,
                                                       in_stack_fffffffffffff178),
                                       (char *)in_stack_fffffffffffff170);
                if (local_cac == -1) {
                  local_cb8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (in_RDI + 0x28),(long)local_92c);
                  local_cac = local_92c;
                  in_stack_fffffffffffff180 = (Net *)local_cd9;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff1a0,(char *)in_stack_fffffffffffff198,
                             (allocator<char> *)in_stack_fffffffffffff190);
                  std::__cxx11::string::operator=((string *)local_cb8,(string *)(local_cd9 + 1));
                  std::__cxx11::string::~string((string *)(local_cd9 + 1));
                  std::allocator<char>::~allocator((allocator<char> *)local_cd9);
                  local_92c = local_92c + 1;
                }
                local_ce8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_cac);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff170,
                           (value_type_conflict1 *)
                           CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168));
                in_stack_fffffffffffff17c = local_cac;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_b58->bottoms,(long)local_ba8);
                *pvVar6 = in_stack_fffffffffffff17c;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff180,
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
              for (local_cec = 0; local_cec < local_b40; local_cec = local_cec + 1) {
                local_cf8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_92c);
                in_stack_fffffffffffff178 =
                     (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_df8);
                if (in_stack_fffffffffffff178 != 1) {
                  fprintf(_stderr,"parse blob_name failed\n");
                  local_4 = -1;
                  goto LAB_00116ba9;
                }
                in_stack_fffffffffffff170 = (ParamDict *)local_e19;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff1a0,(char *)in_stack_fffffffffffff198,
                           (allocator<char> *)in_stack_fffffffffffff190);
                std::__cxx11::string::operator=((string *)local_cf8,(string *)(local_e19 + 1));
                std::__cxx11::string::~string((string *)(local_e19 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_e19);
                local_cf8->producer = local_930;
                in_stack_fffffffffffff16c = local_92c;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_b58->tops,(long)local_cec);
                *pvVar6 = in_stack_fffffffffffff16c;
                local_92c = local_92c + 1;
              }
              in_stack_fffffffffffff168 =
                   ParamDict::load_param
                             ((ParamDict *)CONCAT44(iVar1,iVar2),(DataReader *)CONCAT44(iVar3,iVar4)
                             );
              if (in_stack_fffffffffffff168 == 0) {
                in_stack_fffffffffffff164 = (*local_b58->_vptr_Layer[2])(local_b58,local_928);
                if (in_stack_fffffffffffff164 == 0) {
                  in_stack_fffffffffffff158 = local_b58;
                  ppLVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                       (in_RDI + 0x40),(long)local_930);
                  *ppLVar7 = in_stack_fffffffffffff158;
                }
                else {
                  fprintf(_stderr,"layer load_param failed\n");
                }
              }
              else {
                fprintf(_stderr,"ParamDict load_param failed\n");
              }
            }
            local_4 = 0;
LAB_00116ba9:
            local_b50 = 1;
            ParamDict::~ParamDict(in_stack_fffffffffffff170);
          }
        }
        else {
          fprintf(_stderr,"parse blob_count failed\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"parse layer_count failed\n");
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"parse magic failed\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        fprintf(stderr, "parse " #v " failed\n"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %s not exists or registered\n", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d %s\n", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 fprintf(stderr, "new blob %s\n", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}